

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O2

TokenType __thiscall TokenScanner::getTokenType(TokenScanner *this,string *token)

{
  char ch;
  bool bVar1;
  int iVar2;
  TokenType TVar3;
  
  bVar1 = std::operator==(token,"");
  if (bVar1) {
    TVar3 = ~SEPARATOR;
  }
  else {
    ch = *(token->_M_dataplus)._M_p;
    iVar2 = isspace((int)ch);
    TVar3 = SEPARATOR;
    if ((iVar2 == 0) && (TVar3 = STRING, ch != '\"')) {
      if (ch == '\'') {
        if (1 < token->_M_string_length) {
          return STRING;
        }
      }
      else if ((int)ch - 0x30U < 10) {
        return NUMBER;
      }
      bVar1 = isWordCharacter(this,ch);
      TVar3 = (uint)!bVar1 + (uint)!bVar1 * 2 + WORD;
    }
  }
  return TVar3;
}

Assistant:

TokenType TokenScanner::getTokenType(string token) const {
   if (token == "") return TokenType(EOF);
   char ch = token[0];
   if (isspace(ch)) return SEPARATOR;
   if (ch == '"' || (ch == '\'' && token.length() > 1)) return STRING;
   if (isdigit(ch)) return NUMBER;
   if (isWordCharacter(ch)) return WORD;
   return OPERATOR;
}